

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZmqContextManager.cpp
# Opt level: O3

context_t * ZmqContextManager::getContext(string *contextName)

{
  context_t *pcVar1;
  _Alloc_hider local_18;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_10;
  
  getContextPointer((ZmqContextManager *)&stack0xffffffffffffffe8,contextName);
  pcVar1 = *(context_t **)(local_18._M_p + 0x20);
  if (local_10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_10);
  }
  return pcVar1;
}

Assistant:

zmq::context_t& ZmqContextManager::getContext(const std::string& contextName)
{
    return getContextPointer(contextName)->getBaseContext();
}